

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::StrPair::ParseText(StrPair *this,char *p,char *endTag,int strFlags)

{
  int iVar1;
  char *end;
  char *in_RDX;
  StrPair *in_RSI;
  undefined8 in_RDI;
  size_t length;
  char endChar;
  char *start;
  undefined7 in_stack_ffffffffffffffc8;
  char cVar2;
  StrPair *this_00;
  StrPair *local_18;
  
  cVar2 = *in_RDX;
  this_00 = in_RSI;
  end = (char *)strlen(in_RDX);
  local_18 = in_RSI;
  while( true ) {
    if ((char)local_18->_flags == '\0') {
      return (char *)0x0;
    }
    if (((char)local_18->_flags == cVar2) &&
       (iVar1 = strncmp((char *)local_18,in_RDX,(size_t)end), iVar1 == 0)) break;
    local_18 = (StrPair *)((long)&local_18->_flags + 1);
  }
  Set(this_00,(char *)CONCAT17(cVar2,in_stack_ffffffffffffffc8),end,(int)((ulong)in_RDI >> 0x20));
  return end + (long)&local_18->_flags;
}

Assistant:

char* StrPair::ParseText( char* p, const char* endTag, int strFlags )
{
    TIXMLASSERT( endTag && *endTag );

    char* start = p;
    char  endChar = *endTag;
    size_t length = strlen( endTag );

    // Inner loop of text parsing.
    while ( *p ) {
        if ( *p == endChar && strncmp( p, endTag, length ) == 0 ) {
            Set( start, p, strFlags );
            return p + length;
        }
        ++p;
    }
    return 0;
}